

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateCopyInitFields
          (MessageGenerator *this,Printer *p)

{
  initializer_list<google::protobuf::io::Printer::Sub> v;
  initializer_list<google::protobuf::io::Printer::Sub> v_00;
  const_iterator cVar1;
  bool bVar2;
  int iVar3;
  Sub *local_4b0;
  Sub *local_488;
  basic_string_view<char,_std::char_traits<char>_> local_448;
  undefined1 local_432;
  allocator<char> local_431;
  string local_430;
  Sub *local_410;
  Sub local_408;
  iterator local_350;
  size_type local_348;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_340;
  basic_string_view<char,_std::char_traits<char>_> local_328;
  undefined1 local_312;
  allocator<char> local_311;
  string local_310;
  allocator<char> local_2d9;
  string local_2d8;
  undefined8 local_2b8;
  Sub local_2b0;
  Sub local_1f8;
  iterator local_140;
  size_type local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_130;
  basic_string_view<char,_std::char_traits<char>_> local_118;
  undefined1 local_108 [8];
  anon_class_16_2_fd512ddd_for_cb generate_copy_oneof_fields;
  anon_class_48_6_8056b5bc_for_cb generate_copy_split_fields;
  anon_class_56_7_4dec3439_for_cb generate_copy_fields;
  anon_class_32_4_40eba909 emit_copy_message;
  anon_class_16_2_fd512ddd has_message;
  anon_class_24_3_e47482a1 load_has_bits;
  Printer *pPStack_40;
  int has_bit_word_index;
  anon_class_16_2_a9d32e29 emit_pending_copy_fields;
  FieldDescriptor *first;
  const_iterator end;
  const_iterator begin;
  Printer *p_local;
  MessageGenerator *this_local;
  
  begin._M_current = (FieldDescriptor **)p;
  end = std::
        vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ::begin(&this->optimized_order_);
  first = (FieldDescriptor *)
          std::
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ::end(&this->optimized_order_);
  emit_pending_copy_fields.p = (Printer **)0x0;
  pPStack_40 = (Printer *)&emit_pending_copy_fields.p;
  emit_pending_copy_fields.first = (FieldDescriptor **)&begin;
  load_has_bits.p._4_4_ = 0xffffffff;
  load_has_bits.this = (MessageGenerator *)((long)&load_has_bits.p + 4);
  load_has_bits.has_bit_word_index = (int *)&begin;
  has_message.this = (MessageGenerator *)&begin;
  generate_copy_fields.first = (FieldDescriptor **)&has_message.p;
  emit_copy_message.load_has_bits = (anon_class_24_3_e47482a1 *)&begin;
  emit_copy_message.p = (Printer **)&emit_copy_message.this;
  generate_copy_split_fields.first = (FieldDescriptor **)&end;
  generate_copy_fields.begin = (const_iterator *)&first;
  generate_copy_fields.this = (MessageGenerator *)&begin;
  generate_copy_fields.p = &stack0xffffffffffffffc0;
  generate_copy_fields.emit_pending_copy_fields =
       (anon_class_16_2_a9d32e29 *)&generate_copy_fields.first;
  generate_copy_fields.emit_copy_message = (anon_class_32_4_40eba909 *)&emit_pending_copy_fields.p;
  generate_copy_oneof_fields.p = (Printer **)&end;
  generate_copy_split_fields.begin = (const_iterator *)&first;
  generate_copy_split_fields.this = (MessageGenerator *)&begin;
  generate_copy_split_fields.p = &stack0xffffffffffffffc0;
  generate_copy_split_fields.emit_pending_copy_fields =
       (anon_class_16_2_a9d32e29 *)&emit_pending_copy_fields.p;
  generate_copy_oneof_fields.this = (MessageGenerator *)&begin;
  local_108 = (undefined1  [8])this;
  generate_copy_split_fields.end = (const_iterator *)this;
  generate_copy_fields.end = (const_iterator *)this;
  emit_copy_message.has_message = (anon_class_16_2_fd512ddd *)this;
  emit_copy_message.this = this;
  has_message.p = (Printer **)this;
  iVar3 = Descriptor::extension_range_count(this->descriptor_);
  cVar1 = begin;
  if (0 < iVar3) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_118,
               "\n      _impl_._extensions_.MergeFrom(this, from._impl_._extensions_);\n    ");
    io::Printer::SourceLocation::current();
    io::Printer::Emit((Printer *)cVar1._M_current,local_118._M_len,local_118._M_str);
  }
  cVar1._M_current = begin._M_current;
  local_312 = '\x01';
  local_2b8 = &local_2b0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d8,"copy_fields",&local_2d9);
  io::Printer::Sub::
  Sub<google::protobuf::compiler::cpp::MessageGenerator::GenerateCopyInitFields(google::protobuf::io::Printer*)const::__0&>
            (&local_2b0,&local_2d8,
             (anon_class_56_7_4dec3439_for_cb *)&generate_copy_split_fields.first);
  local_2b8 = &local_1f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_310,"copy_oneof_fields",&local_311);
  io::Printer::Sub::
  Sub<google::protobuf::compiler::cpp::MessageGenerator::GenerateCopyInitFields(google::protobuf::io::Printer*)const::__1&>
            (&local_1f8,&local_310,(anon_class_16_2_fd512ddd_for_cb *)local_108);
  local_312 = '\0';
  local_140 = &local_2b0;
  local_138 = 2;
  v_00._M_len = 2;
  v_00._M_array = local_140;
  absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
  Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
            ((Span<google::protobuf::io::Printer::Sub_const> *)local_130._M_local_buf,v_00);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_328,"\n            $copy_fields$;\n            $copy_oneof_fields$;\n          "
            );
  io::Printer::SourceLocation::current();
  io::Printer::Emit((Printer *)cVar1._M_current,local_130._M_allocated_capacity,local_130._8_8_,
                    local_328._M_len,local_328._M_str);
  local_488 = (Sub *)&local_140;
  do {
    local_488 = local_488 + -1;
    io::Printer::Sub::~Sub(local_488);
  } while (local_488 != &local_2b0);
  std::__cxx11::string::~string((string *)&local_310);
  std::allocator<char>::~allocator(&local_311);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::allocator<char>::~allocator(&local_2d9);
  bVar2 = ShouldSplit(this->descriptor_,&this->options_);
  cVar1 = begin;
  if (bVar2) {
    local_432 = 1;
    local_410 = &local_408;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_430,"copy_split_fields",&local_431);
    io::Printer::Sub::
    Sub<google::protobuf::compiler::cpp::MessageGenerator::GenerateCopyInitFields(google::protobuf::io::Printer*)const::__2&>
              (&local_408,&local_430,
               (anon_class_48_6_8056b5bc_for_cb *)&generate_copy_oneof_fields.p);
    local_432 = 0;
    local_350 = &local_408;
    local_348 = 1;
    v._M_len = 1;
    v._M_array = local_350;
    absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
    Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
              ((Span<google::protobuf::io::Printer::Sub_const> *)local_340._M_local_buf,v);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_448,
               "\n              if (ABSL_PREDICT_FALSE(!from.IsSplitMessageDefault())) {\n                PrepareSplitMessageForWrite();\n                $copy_split_fields$;\n              }\n            "
              );
    io::Printer::SourceLocation::current();
    io::Printer::Emit((Printer *)cVar1._M_current,local_340._M_allocated_capacity,local_340._8_8_,
                      local_448._M_len,local_448._M_str);
    local_4b0 = (Sub *)&local_350;
    do {
      local_4b0 = local_4b0 + -1;
      io::Printer::Sub::~Sub(local_4b0);
    } while (local_4b0 != &local_408);
    std::__cxx11::string::~string((string *)&local_430);
    std::allocator<char>::~allocator(&local_431);
  }
  return;
}

Assistant:

void MessageGenerator::GenerateCopyInitFields(io::Printer* p) const {
  auto begin = optimized_order_.begin();
  auto end = optimized_order_.end();
  const FieldDescriptor* first = nullptr;

  auto emit_pending_copy_fields = [&](decltype(end) itend, bool split) {
    if (first != nullptr) {
      const FieldDescriptor* last = itend[-1];
      if (first != last) {
        p->Emit({{"first", FieldName(first)},
                 {"last", FieldName(last)},
                 {"Impl", split ? "Impl_::Split" : "Impl_"},
                 {"pdst", split ? "_impl_._split_" : "&_impl_"},
                 {"psrc", split ? "from._impl_._split_" : "&from._impl_"}},
                R"cc(
                  ::memcpy(reinterpret_cast<char *>($pdst$) +
                               offsetof($Impl$, $first$_),
                           reinterpret_cast<const char *>($psrc$) +
                               offsetof($Impl$, $first$_),
                           offsetof($Impl$, $last$_) -
                               offsetof($Impl$, $first$_) +
                               sizeof($Impl$::$last$_));
                )cc");
      } else {
        p->Emit({{"field", FieldMemberName(first, split)}},
                R"cc(
                  $field$ = from.$field$;
                )cc");
      }
      first = nullptr;
    }
  };

  int has_bit_word_index = -1;
  auto load_has_bits = [&](const FieldDescriptor* field) {
    if (has_bit_indices_.empty()) return;
    int has_bit_index = has_bit_indices_[field->index()];
    if (has_bit_word_index != has_bit_index / 32) {
      p->Emit({{"declare", has_bit_word_index < 0 ? "::uint32_t " : ""},
               {"index", has_bit_index / 32}},
              "$declare$cached_has_bits = _impl_._has_bits_[$index$];\n");
      has_bit_word_index = has_bit_index / 32;
    }
  };

  auto has_message = [&](const FieldDescriptor* field) {
    if (has_bit_indices_.empty()) {
      p->Emit("from.$field$ != nullptr");
    } else {
      int has_bit_index = has_bit_indices_[field->index()];
      p->Emit({{"condition", GenerateConditionMaybeWithProbabilityForField(
                                 has_bit_index, field, options_)}},
              "$condition$");
    }
  };

  auto emit_copy_message = [&](const FieldDescriptor* field) {
    load_has_bits(field);
    p->Emit({{"has_msg", [&] { has_message(field); }},
             {"submsg", FieldMessageTypeName(field, options_)}},
            R"cc(
              $field$ = ($has_msg$)
                            ? $superclass$::CopyConstruct(arena, *from.$field$)
                            : nullptr;
            )cc");
  };

  auto generate_copy_fields = [&] {
    for (auto it = begin; it != end; ++it) {
      const auto& gen = field_generators_.get(*it);
      auto v = p->WithVars(FieldVars(*it, options_));

      // Non trivial field values are copy constructed
      if (!gen.has_trivial_value() || gen.should_split()) {
        emit_pending_copy_fields(it, false);
        continue;
      }

      if (gen.is_message()) {
        emit_pending_copy_fields(it, false);
        emit_copy_message(*it);
      } else if (first == nullptr) {
        first = *it;
      }
    }
    emit_pending_copy_fields(end, false);
  };

  auto generate_copy_split_fields = [&] {
    for (auto it = begin; it != end; ++it) {
      const auto& gen = field_generators_.get(*it);
      auto v = p->WithVars(FieldVars(*it, options_));

      if (!gen.should_split()) {
        emit_pending_copy_fields(it, true);
        continue;
      }

      if (gen.is_trivial()) {
        if (first == nullptr) first = *it;
      } else {
        emit_pending_copy_fields(it, true);
        gen.GenerateCopyConstructorCode(p);
      }
    }
    emit_pending_copy_fields(end, true);
  };

  auto generate_copy_oneof_fields = [&]() {
    for (const auto* oneof : OneOfRange(descriptor_)) {
      p->Emit(
          {{"name", oneof->name()},
           {"NAME", absl::AsciiStrToUpper(oneof->name())},
           {"cases",
            [&] {
              for (const auto* field : FieldRange(oneof)) {
                p->Emit(
                    {{"Name", UnderscoresToCamelCase(field->name(), true)},
                     {"field", FieldMemberName(field, /*split=*/false)},
                     {"body",
                      [&] {
                        field_generators_.get(field).GenerateOneofCopyConstruct(
                            p);
                      }}},
                    R"cc(
                      case k$Name$:
                        $body$;
                        break;
                    )cc");
              }
            }}},
          R"cc(
            switch ($name$_case()) {
              case $NAME$_NOT_SET:
                break;
                $cases$;
            }
          )cc");
    }
  };

  if (descriptor_->extension_range_count() > 0) {
    p->Emit(R"cc(
      _impl_._extensions_.MergeFrom(this, from._impl_._extensions_);
    )cc");
  }

  p->Emit({{"copy_fields", generate_copy_fields},
           {"copy_oneof_fields", generate_copy_oneof_fields}},
          R"cc(
            $copy_fields$;
            $copy_oneof_fields$;
          )cc");

  if (ShouldSplit(descriptor_, options_)) {
    p->Emit({{"copy_split_fields", generate_copy_split_fields}},
            R"cc(
              if (ABSL_PREDICT_FALSE(!from.IsSplitMessageDefault())) {
                PrepareSplitMessageForWrite();
                $copy_split_fields$;
              }
            )cc");
  }
}